

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudioSourceVoice_Start(FAudioSourceVoice *voice,uint32_t Flags,uint32_t OperationSet)

{
  if ((OperationSet == 0) || (voice->audio->active == '\0')) {
    (voice->field_19).src.active = '\x01';
  }
  else {
    FAudio_OPERATIONSET_QueueStart(voice,Flags,OperationSet);
  }
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_Start(
	FAudioSourceVoice *voice,
	uint32_t Flags,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueStart(
			voice,
			Flags,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}


	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);

	FAudio_assert(Flags == 0);
	voice->src.active = 1;
	LOG_API_EXIT(voice->audio)
	return 0;
}